

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int Gia_ManFactorSop(Gia_Man_t *p,Vec_Int_t *vCiObjIds,Vec_Str_t *vSop,int fHash)

{
  int iVar1;
  uint uVar2;
  uint Lit;
  int iVar3;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  p_00 = Abc_SopSynthesizeOne(vSop->pArray,1);
  iVar1 = p_00->vCis->nSize;
  iVar3 = p_00->nRegs;
  if (iVar1 - iVar3 != vCiObjIds->nSize) {
    __assert_fail("Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x42b,"int Gia_ManFactorSop(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  p_00->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < iVar1 - iVar3; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManCi(p_00,iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Vec_IntEntry(vCiObjIds,iVar8);
    uVar2 = Abc_Var2Lit(iVar1,0);
    pGVar4->Value = uVar2;
    iVar1 = p_00->vCis->nSize;
    iVar3 = p_00->nRegs;
  }
  for (iVar1 = 0; iVar1 < p_00->nObjs; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManObj(p_00,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      uVar2 = Gia_ObjFanin0Copy(pGVar4);
      Lit = Gia_ObjFanin1Copy(pGVar4);
      if (fHash == 0) {
        pObj = Gia_ManAppendObj(p);
        iVar3 = Abc_Lit2Var(uVar2);
        if (p->nObjs <= iVar3) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar3 = Abc_Lit2Var(Lit);
        if (p->nObjs <= iVar3) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if (p->fGiaSimple == 0) {
          iVar3 = Abc_Lit2Var(uVar2);
          iVar8 = Abc_Lit2Var(Lit);
          if (iVar3 == iVar8) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
        }
        iVar3 = Gia_ObjId(p,pObj);
        iVar8 = Abc_Lit2Var(uVar2);
        uVar6 = (ulong)(iVar3 - iVar8 & 0x1fffffff);
        if (uVar2 < Lit) {
          *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar6;
          iVar3 = Abc_LitIsCompl(uVar2);
          *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
          iVar3 = Gia_ObjId(p,pObj);
          iVar8 = Abc_Lit2Var(Lit);
          *(ulong *)pObj =
               *(ulong *)pObj & 0xe0000000ffffffff | (ulong)(iVar3 - iVar8 & 0x1fffffff) << 0x20;
          uVar2 = Abc_LitIsCompl(Lit);
          uVar5 = (ulong)uVar2 << 0x3d;
          uVar6 = *(ulong *)pObj;
          uVar7 = 0xdfffffffffffffff;
        }
        else {
          *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar6 << 0x20;
          uVar2 = Abc_LitIsCompl(uVar2);
          *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | (ulong)uVar2 << 0x3d;
          iVar3 = Gia_ObjId(p,pObj);
          iVar8 = Abc_Lit2Var(Lit);
          *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | (ulong)(iVar3 - iVar8 & 0x1fffffff)
          ;
          iVar3 = Abc_LitIsCompl(Lit);
          uVar5 = (ulong)(uint)(iVar3 << 0x1d);
          uVar6 = *(ulong *)pObj;
          uVar7 = 0xffffffffdfffffff;
        }
        *(ulong *)pObj = uVar6 & uVar7 | uVar5;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pObj + -(uVar6 & uVar7 & 0x1fffffff),pObj);
          Gia_ObjAddFanout(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pObj);
        }
        if (p->fSweeper != 0) {
          uVar5 = *(ulong *)pObj & 0x1fffffff;
          uVar6 = *(ulong *)pObj >> 0x20 & 0x1fffffff;
          uVar7 = 0x4000000000000000;
          if (((uint)*(ulong *)(pObj + -uVar5) >> 0x1e & 1) == 0) {
            uVar7 = 0x40000000;
          }
          *(ulong *)(pObj + -uVar5) = uVar7 | *(ulong *)(pObj + -uVar5);
          uVar7 = *(ulong *)(pObj + -uVar6);
          uVar9 = 0x4000000000000000;
          if (((uint)uVar7 >> 0x1e & 1) == 0) {
            uVar9 = 0x40000000;
          }
          *(ulong *)(pObj + -uVar6) = uVar9 | uVar7;
          uVar6 = *(ulong *)pObj;
          *(ulong *)pObj =
               uVar6 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar6 >> 0x3d) ^ (uint)(uVar7 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pObj + -uVar5) >> 0x3f) ^
                      (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
        }
        if (p->fBuiltInSim != 0) {
          uVar6 = *(ulong *)pObj;
          *(ulong *)pObj =
               uVar6 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar6 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pObj + -(uVar6 >> 0x20 & 0x1fffffff)) >> 0x3f))
                      & ((uint)((ulong)*(undefined8 *)(pObj + -(uVar6 & 0x1fffffff)) >> 0x3f) ^
                        (uint)(uVar6 >> 0x1d) & 7)) << 0x3f;
          iVar3 = Gia_ObjId(p,pObj);
          Gia_ManBuiltInSimPerform(p,iVar3);
        }
        if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(p,pObj);
        }
        iVar3 = Gia_ObjId(p,pObj);
        uVar2 = iVar3 * 2;
      }
      else {
        uVar2 = Gia_ManHashAnd(p,uVar2,Lit);
      }
      pGVar4->Value = uVar2;
    }
  }
  pGVar4 = Gia_ManPo(p_00,0);
  iVar1 = Gia_ObjFanin0Copy(pGVar4);
  Gia_ManStop(p_00);
  return iVar1;
}

Assistant:

int Gia_ManFactorSop( Gia_Man_t * p, Vec_Int_t * vCiObjIds, Vec_Str_t * vSop, int fHash )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );
    Gia_Man_t * pMan = Abc_SopSynthesizeOne( Vec_StrArray(vSop), 1 );
    Gia_Obj_t * pObj; int i, Result;
    assert( Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds) );
    Gia_ManConst0(pMan)->Value = 0;
    Gia_ManForEachPi( pMan, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vCiObjIds, i), 0 );
    Gia_ManForEachAnd( pMan, pObj, i )
        if ( fHash )
            pObj->Value = Gia_ManHashAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManPo(pMan, 0);
    Result = Gia_ObjFanin0Copy(pObj);
    Gia_ManStop( pMan );
    return Result;
}